

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_panel.cxx
# Opt level: O2

void cb_template_name(Fl_Input *param_1,void *param_2)

{
  if (*(template_name->super_Fl_Input_).value_ == '\0') {
    Fl_Widget::deactivate((Fl_Widget *)template_submit);
    return;
  }
  Fl_Widget::activate((Fl_Widget *)template_submit);
  if (Fl::e_keysym == 0xff0d) {
    (*(template_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
    return;
  }
  return;
}

Assistant:

static void cb_template_name(Fl_Input*, void*) {
  if (strlen(template_name->value())) {
  template_submit->activate();
  if (Fl::event_key() == FL_Enter) template_panel->hide();
} else template_submit->deactivate();
}